

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O1

void duckdb::StrfTimeFunctionDate<true>(DataChunk *args,ExpressionState *state,Vector *result)

{
  BoundFunctionExpression *pBVar1;
  pointer pFVar2;
  reference input;
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar1->bind_info);
  if (*(char *)&pFVar2[0x1c]._vptr_FunctionData == '\x01') {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  input = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  StrfTimeFormat::ConvertDateVector((StrfTimeFormat *)(pFVar2 + 1),input,result,args->count);
  return;
}

Assistant:

static void StrfTimeFunctionDate(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<StrfTimeBindData>();

	if (info.is_null) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}
	info.format.ConvertDateVector(args.data[REVERSED ? 1 : 0], result, args.size());
}